

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

DataBuffer * __thiscall MIDI::Track::data(DataBuffer *__return_storage_ptr__,Track *this)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  size_type __n;
  reference ppEVar4;
  void *__buf;
  DataBuffer local_a0;
  ChannelEvent *local_88;
  byte *local_80;
  uint local_78;
  ChannelEvent *local_70;
  byte *local_68;
  uint local_60;
  ChannelEvent *local_58;
  byte *local_50;
  uint local_48;
  ChannelEvent *local_40;
  ChannelEvent *chevent;
  DataBuffer eventData;
  int i;
  byte lastCommand;
  Track *this_local;
  DataBuffer *data;
  
  DataBuffer::DataBuffer(__return_storage_ptr__,1000000);
  eventData._23_1_ = 0;
  eventData._pos = 0;
  while( true ) {
    uVar3 = (ulong)(int)eventData._pos;
    __n = std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::size(&this->_events);
    if (__n <= uVar3) break;
    DataBuffer::DataBuffer((DataBuffer *)&chevent);
    ppEVar4 = std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::operator[]
                        (&this->_events,(long)(int)eventData._pos);
    iVar2 = (**(*ppEVar4)->_vptr_Event)();
    if (iVar2 == 1) {
      ppEVar4 = std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::operator[]
                          (&this->_events,(long)(int)eventData._pos);
      local_40 = (ChannelEvent *)*ppEVar4;
      bVar1 = ChannelEvent::command(local_40);
      __n = (size_type)(byte)eventData._23_1_;
      if (bVar1 == eventData._23_1_) {
        (*(local_40->super_Event)._vptr_Event[3])(&local_58,local_40,1);
        chevent = local_58;
        eventData._data = local_50;
        eventData._size = local_48;
      }
      else {
        (*(local_40->super_Event)._vptr_Event[3])(&local_70,local_40,0);
        chevent = local_70;
        eventData._data = local_68;
        eventData._size = local_60;
      }
      eventData._23_1_ = ChannelEvent::command(local_40);
    }
    else {
      ppEVar4 = std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::operator[]
                          (&this->_events,(long)(int)eventData._pos);
      (*(*ppEVar4)->_vptr_Event[1])(&local_88);
      chevent = local_88;
      eventData._data = local_80;
      eventData._size = local_78;
    }
    DataBuffer::DataBuffer(&local_a0,(DataBuffer *)&chevent);
    DataBuffer::write(__return_storage_ptr__,(int)&local_a0,__buf,__n);
    eventData._pos = eventData._pos + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

DataBuffer Track::data()
  {
    DataBuffer data(1000000);
    
    byte lastCommand=MIDI_CHEVENT_INVALID;
    
    for(int i=0;i<_events.size();i++)
      {
	DataBuffer eventData;
	if(_events[i]->type()==MIDI_CHEVENT)
	  {
	    ChannelEvent *chevent=(ChannelEvent*)_events[i];
	    if(chevent->command()==lastCommand)
	      eventData=chevent->data(true);
	    else
	      eventData=chevent->data(false);
	    
	    lastCommand=chevent->command();
	  }
	else
	  eventData=_events[i]->data();
	
	data.write(eventData);
      }
    
    return data;
  }